

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          int num_digits,string_view prefix,basic_format_specs<char> *spec,bin_writer<1> f)

{
  int value;
  type tVar1;
  type tVar2;
  size_t sVar3;
  alignment aVar4;
  ulong uVar5;
  ulong uVar6;
  align_spec as;
  align_spec local_78;
  bin_writer<1> local_68;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<unsigned_int,_fmt::v5::basic_format_specs<char>_>::bin_writer<1>_>
  local_60;
  
  sVar3 = prefix.size_;
  local_68 = f;
  tVar1 = internal::to_unsigned<int>(num_digits);
  uVar6 = tVar1 + sVar3;
  local_60.fill = (char_type)(spec->super_align_spec).fill_;
  aVar4 = (spec->super_align_spec).align_;
  if (aVar4 == ALIGN_NUMERIC) {
    uVar5 = (ulong)(spec->super_align_spec).width_;
    local_60.size_ = uVar5;
    if (uVar5 < uVar6) {
      local_60.size_ = uVar6;
    }
    local_60.padding = 0;
    if (uVar6 <= uVar5) {
      local_60.padding = uVar5 - uVar6;
    }
    local_78.align_ = (spec->super_align_spec).align_;
    local_78.width_ = (spec->super_align_spec).width_;
    local_78.fill_ = (spec->super_align_spec).fill_;
  }
  else {
    value = (spec->super_core_format_specs).precision;
    if (num_digits < value) {
      tVar1 = internal::to_unsigned<int>(value);
      tVar2 = internal::to_unsigned<int>((spec->super_core_format_specs).precision - num_digits);
      local_60.padding = (size_t)tVar2;
      aVar4 = (spec->super_align_spec).align_;
      local_60.fill = '0';
      local_60.size_ = tVar1 + sVar3;
    }
    else {
      local_60.padding = 0;
      local_60.size_ = uVar6;
    }
    local_78.align_ = (spec->super_align_spec).align_;
    local_78.width_ = (spec->super_align_spec).width_;
    local_78.fill_ = (spec->super_align_spec).fill_;
    if (aVar4 == ALIGN_DEFAULT) {
      local_78.align_ = ALIGN_RIGHT;
    }
  }
  local_60.f = local_68;
  local_60.prefix.data_ = prefix.data_;
  local_60.prefix.size_ = sVar3;
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>>
            (this,&local_78,&local_60);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix,
                 const Spec &spec, F f) {
    std::size_t size = prefix.size() + internal::to_unsigned(num_digits);
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = 0;
    if (spec.align() == ALIGN_NUMERIC) {
      if (spec.width() > size) {
        padding = spec.width() - size;
        size = spec.width();
      }
    } else if (spec.precision > num_digits) {
      size = prefix.size() + internal::to_unsigned(spec.precision);
      padding = internal::to_unsigned(spec.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    align_spec as = spec;
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    write_padded(as, padded_int_writer<F>{size, prefix, fill, padding, f});
  }